

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakCallback.h
# Opt level: O3

void __thiscall
sznet::WeakCallback<sznet::net::KcpConnection>::WeakCallback
          (WeakCallback<sznet::net::KcpConnection> *this,weak_ptr<sznet::net::KcpConnection> *object
          ,function<void_(sznet::net::KcpConnection_*)> *function)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->m_object).super___weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (object->super___weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (object->super___weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->m_object).super___weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
    }
  }
  std::function<void_(sznet::net::KcpConnection_*)>::function(&this->m_function,function);
  return;
}

Assistant:

WeakCallback(const std::weak_ptr<CLASS>& object, const std::function<void(CLASS*, ARGS...)>& function): 
		m_object(object),
		m_function(function)
	{
	}